

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cc
# Opt level: O2

int TVMBackendParallelLaunch(FTVMParallelLambda flambda,void *cdata,int num_task)

{
  int iVar1;
  uint uVar2;
  int i;
  int iVar3;
  TVMParallelGroupEnv penv_;
  
  penv_.num_task = 1;
  if (1 < num_task) {
    penv_.num_task = num_task;
  }
  penv_.sync_handle = (void *)0x0;
  uVar2 = 0;
  for (iVar3 = 0; iVar3 < penv_.num_task; iVar3 = iVar3 + 1) {
    iVar1 = (*flambda)(iVar3,&penv_,cdata);
    uVar2 = uVar2 | -(uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

int TVMBackendParallelLaunch(
    FTVMParallelLambda flambda,
    void *cdata,
    int num_task) {

  /* [RISCV-DLR] use the master thread to run all tasks */
#ifdef DEBUG_DLR
  printf("[ParallelLaunch] num task : %d\n", num_task);
#endif
  TVMParallelGroupEnv penv_;
  TVMParallelGroupEnv *penv = &penv_;
  penv_.num_task = std::max(num_task, 1);
  penv_.sync_handle = nullptr;

  int res = 0;
#ifdef DEBUG_DLR
  printf("[ParallelLaunch] run task : ");
#endif
  for (int i = 0; i < penv_.num_task; i++) {
    if ((*flambda)(i, penv, cdata) == 0) {
      /* 0,1,2 ...*/
#ifdef DEBUG_DLR
      printf("%d\b", i);
      fflush(stdout);
#endif
    } else
      res = -1;
#ifdef DEBUG_DLR
    printf("\n");
#endif
  }
  return res;

  /*
  int res = tvm::runtime::ThreadPool::ThreadLocal()->Launch(
      flambda, cdata, num_task, 1);

    return res;
*/
}